

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

bool __thiscall
Js::ScriptContext::EnsureInterpreterArena(ScriptContext *this,ArenaAllocator **ppAlloc)

{
  Recycler *this_00;
  ArenaAllocator *pAVar1;
  bool bVar2;
  bool fNew;
  ArenaAllocator **ppAlloc_local;
  ScriptContext *this_local;
  
  bVar2 = this->interpreterArena == (ArenaAllocator *)0x0;
  if (bVar2) {
    this_00 = GetRecycler(this);
    pAVar1 = Memory::Recycler::CreateGuestArena(this_00,L"Interpreter",Throw::OutOfMemory);
    this->interpreterArena = pAVar1;
  }
  *ppAlloc = this->interpreterArena;
  return bVar2;
}

Assistant:

bool ScriptContext::EnsureInterpreterArena(ArenaAllocator **ppAlloc)
    {
        bool fNew = false;
        if (this->interpreterArena == nullptr)
        {
            this->interpreterArena = this->GetRecycler()->CreateGuestArena(_u("Interpreter"), Throw::OutOfMemory);
            fNew = true;
        }
        *ppAlloc = this->interpreterArena;
        return fNew;
    }